

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::
Stack<std::unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>_>
::expand(Stack<std::unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>_>
         *this)

{
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**> *pSVar1;
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**> *this_00
  ;
  unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
  *in_RDI;
  size_t i;
  unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
  *newStack;
  void *mem;
  size_t newCapacity;
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**> *pSVar2;
  Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
  *local_28;
  
  if ((in_RDI->_M_t).
      super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_false>
      ._M_head_impl ==
      (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**> *)
      0x0) {
    pSVar1 = (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)0x8;
  }
  else {
    pSVar1 = (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)((long)(in_RDI->_M_t).
                       super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_false>
                       ._M_head_impl << 1);
  }
  pSVar2 = pSVar1;
  this_00 = (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
             *)Lib::alloc((size_t)in_RDI);
  if ((in_RDI->_M_t).
      super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
      .
      super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_false>
      ._M_head_impl !=
      (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**> *)
      0x0) {
    for (local_28 = (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                     *)0x0;
        local_28 <
        (in_RDI->_M_t).
        super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
        .
        super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_false>
        ._M_head_impl;
        local_28 = (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                    *)((long)&local_28->_capacity + 1)) {
      std::
      unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
      ::unique_ptr(in_RDI,(unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
                           *)pSVar2);
      std::
      unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
      ::~unique_ptr((unique_ptr<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
                     *)this_00);
    }
    Lib::free(in_RDI[1]._M_t.
              super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
              .
              super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_false>
              ._M_head_impl);
  }
  in_RDI[1]._M_t.
  super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_false>
  ._M_head_impl = this_00;
  in_RDI[2]._M_t.
  super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_false>
  ._M_head_impl =
       (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**> *)
       (&(in_RDI[1]._M_t.
          super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
          .
          super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_false>
         ._M_head_impl)->_capacity +
       (long)(in_RDI->_M_t).
             super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
             .
             super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_false>
             ._M_head_impl);
  in_RDI[3]._M_t.
  super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_false>
  ._M_head_impl =
       (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**> *)
       (&(in_RDI[1]._M_t.
          super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
          .
          super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_false>
         ._M_head_impl)->_capacity + (long)pSVar1);
  (in_RDI->_M_t).
  super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>_>
  .
  super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_*,_false>
  ._M_head_impl = pSVar1;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }